

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O0

void jinit_2pass_quantizer(j_decompress_ptr cinfo)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  long *in_RDI;
  int desired;
  int i;
  my_cquantize_ptr_conflict cquantize;
  int local_14;
  
  puVar2 = (undefined8 *)(**(code **)in_RDI[1])(in_RDI,1,0x58);
  in_RDI[0x4e] = (long)puVar2;
  *puVar2 = start_pass_2_quant;
  puVar2[3] = new_color_map_2_quant;
  puVar2[8] = 0;
  puVar2[10] = 0;
  if ((int)in_RDI[0x12] != 3) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x2f;
    (**(code **)*in_RDI)(in_RDI);
  }
  uVar3 = (**(code **)in_RDI[1])(in_RDI,1,0x100);
  puVar2[6] = uVar3;
  for (local_14 = 0; local_14 < 0x20; local_14 = local_14 + 1) {
    uVar3 = (**(code **)(in_RDI[1] + 8))(in_RDI,1,0x1000);
    *(undefined8 *)(puVar2[6] + (long)local_14 * 8) = uVar3;
  }
  *(undefined4 *)(puVar2 + 7) = 1;
  if (*(int *)((long)in_RDI + 0x84) == 0) {
    puVar2[4] = 0;
  }
  else {
    iVar1 = (int)in_RDI[0xf];
    if (iVar1 < 8) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x38;
      *(undefined4 *)(*in_RDI + 0x2c) = 8;
      (**(code **)*in_RDI)(in_RDI);
    }
    if (0x100 < iVar1) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x39;
      *(undefined4 *)(*in_RDI + 0x2c) = 0x100;
      (**(code **)*in_RDI)(in_RDI);
    }
    uVar3 = (**(code **)(in_RDI[1] + 0x10))(in_RDI,1,iVar1,3);
    puVar2[4] = uVar3;
    *(int *)(puVar2 + 5) = iVar1;
  }
  if ((int)in_RDI[0xe] != 0) {
    *(undefined4 *)(in_RDI + 0xe) = 2;
  }
  if ((int)in_RDI[0xe] == 2) {
    uVar3 = (**(code **)(in_RDI[1] + 8))(in_RDI,1,(ulong)((int)in_RDI[0x11] + 2) * 6);
    puVar2[8] = uVar3;
    init_error_limit(_desired);
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_2pass_quantizer(j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize;
  int i;

  cquantize = (my_cquantize_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_cquantizer));
  cinfo->cquantize = (struct jpeg_color_quantizer *)cquantize;
  cquantize->pub.start_pass = start_pass_2_quant;
  cquantize->pub.new_color_map = new_color_map_2_quant;
  cquantize->fserrors = NULL;   /* flag optional arrays not allocated */
  cquantize->error_limiter = NULL;

  /* Make sure jdmaster didn't give me a case I can't handle */
  if (cinfo->out_color_components != 3)
    ERREXIT(cinfo, JERR_NOTIMPL);

  /* Allocate the histogram/inverse colormap storage */
  cquantize->histogram = (hist3d)(*cinfo->mem->alloc_small)
    ((j_common_ptr)cinfo, JPOOL_IMAGE, HIST_C0_ELEMS * sizeof(hist2d));
  for (i = 0; i < HIST_C0_ELEMS; i++) {
    cquantize->histogram[i] = (hist2d)(*cinfo->mem->alloc_large)
      ((j_common_ptr)cinfo, JPOOL_IMAGE,
       HIST_C1_ELEMS * HIST_C2_ELEMS * sizeof(histcell));
  }
  cquantize->needs_zeroed = TRUE; /* histogram is garbage now */

  /* Allocate storage for the completed colormap, if required.
   * We do this now since it may affect the memory manager's space
   * calculations.
   */
  if (cinfo->enable_2pass_quant) {
    /* Make sure color count is acceptable */
    int desired = cinfo->desired_number_of_colors;
    /* Lower bound on # of colors ... somewhat arbitrary as long as > 0 */
    if (desired < 8)
      ERREXIT1(cinfo, JERR_QUANT_FEW_COLORS, 8);
    /* Make sure colormap indexes can be represented by JSAMPLEs */
    if (desired > MAXNUMCOLORS)
      ERREXIT1(cinfo, JERR_QUANT_MANY_COLORS, MAXNUMCOLORS);
    cquantize->sv_colormap = (*cinfo->mem->alloc_sarray)
      ((j_common_ptr)cinfo, JPOOL_IMAGE, (JDIMENSION)desired, (JDIMENSION)3);
    cquantize->desired = desired;
  } else
    cquantize->sv_colormap = NULL;

  /* Only F-S dithering or no dithering is supported. */
  /* If user asks for ordered dither, give them F-S. */
  if (cinfo->dither_mode != JDITHER_NONE)
    cinfo->dither_mode = JDITHER_FS;

  /* Allocate Floyd-Steinberg workspace if necessary.
   * This isn't really needed until pass 2, but again it may affect the memory
   * manager's space calculations.  Although we will cope with a later change
   * in dither_mode, we do not promise to honor max_memory_to_use if
   * dither_mode changes.
   */
  if (cinfo->dither_mode == JDITHER_FS) {
    cquantize->fserrors = (FSERRPTR)(*cinfo->mem->alloc_large)
      ((j_common_ptr)cinfo, JPOOL_IMAGE,
       (size_t)((cinfo->output_width + 2) * (3 * sizeof(FSERROR))));
    /* Might as well create the error-limiting table too. */
    init_error_limit(cinfo);
  }
}